

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O1

void test_const_operation<Gudhi::persistence_matrix::Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>
               (void)

{
  Column_support *pCVar1;
  uint uVar2;
  node_ptr plVar3;
  char *pcVar4;
  size_type sVar5;
  node_ptr to_erase;
  Column_zp_settings *this;
  pointer pEVar6;
  uint uVar7;
  undefined4 uVar8;
  long lVar9;
  node_ptr plVar10;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  columns;
  Column_settings settings;
  Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_> m;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>_>
  local_158;
  anon_class_8_1_e4bd5e45 local_138;
  undefined4 uStack_12c;
  uint local_128 [6];
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  local_110;
  undefined1 local_f8 [32];
  simple_segregated_storage<unsigned_long> local_d8;
  char *pcStack_d0;
  size_type local_c8;
  size_type local_b8;
  size_type local_b0;
  anon_class_8_1_e4bd5e45 local_a0;
  undefined1 local_98 [64];
  pointer local_58;
  
  Gudhi::persistence_matrix::
  Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>::
  Column_zp_settings::Column_zp_settings((Column_zp_settings *)local_f8,5);
  build_general_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>>
            ();
  this = (Column_zp_settings *)operator_new(0x58);
  Gudhi::persistence_matrix::
  Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>::
  Column_zp_settings::Column_zp_settings(this,5);
  local_98._0_8_ = this;
  Gudhi::persistence_matrix::
  Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>
  ::
  Base_matrix<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>
              *)(local_98 + 8),&local_110,this);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>
            (&local_110,
             (Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>
              *)local_98);
  pCVar1 = &local_158.column_;
  local_158.operators_ = (Field_operators *)0x200000000;
  local_158.entryPool_ = (Entry_constructor *)0x400000001;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)(local_110.
                 super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 10),&local_158,pCVar1);
  local_128[0] = 0;
  local_128[1] = 1;
  local_128[2] = 1;
  local_128[3] = 4;
  local_128[4] = 4;
  local_128[5] = 1;
  local_158.entryPool_ = (Entry_constructor *)&local_d8;
  local_158.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ = (node_ptr)pCVar1;
  local_158.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_ = (node_ptr)pCVar1;
  lVar9 = 4;
  local_158.operators_ = (Field_operators *)local_f8;
  do {
    uVar7 = *(uint *)((long)local_128 + lVar9);
    uVar2 = ((Field_operators *)&(local_158.operators_)->characteristic_)->characteristic_;
    if (uVar2 <= uVar7) {
      uVar7 = uVar7 % uVar2;
    }
    local_138.targetColumn._0_4_ = *(undefined4 *)((long)&uStack_12c + lVar9);
    pEVar6 = Gudhi::
             Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>>
             ::construct<unsigned_int&>
                       ((Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>>
                         *)local_158.entryPool_,(uint *)&local_138);
    plVar10 = local_158.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_;
    (pEVar6->super_Entry_field_element_option).element_ = uVar7;
    if ((pEVar6->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ !=
        (node_ptr)0x0) goto LAB_00178fef;
    (pEVar6->super_Column_hook).super_type.super_type.super_list_node<void_*>.prev_ =
         local_158.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_;
    (pEVar6->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ =
         (node_ptr)pCVar1;
    local_158.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_ =
         (node_ptr)&pEVar6->super_Column_hook;
    (((type *)&plVar10->next_)->super_type).super_list_node<void_*>.next_ =
         (node_ptr)&pEVar6->super_Column_hook;
    lVar9 = lVar9 + 8;
  } while (lVar9 != 0x1c);
  local_138.targetColumn = local_58 + 10;
  local_a0.targetColumn = local_138.targetColumn;
  Gudhi::persistence_matrix::
  _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>const&,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<false,(Gudhi::persistence_matrix::Col___ns<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>::Matrix_column_tag,1u>,false>&)_1_>
            (&local_158,local_138.targetColumn,(anon_class_1_0_00000001 *)((long)&uStack_12c + 3),
             &local_138,&local_a0,(anon_class_1_0_00000001 *)((long)&uStack_12c + 2),
             (anon_class_1_0_00000001 *)((long)&uStack_12c + 1));
  plVar10 = local_158.column_.super_type.data_.root_plus_size_.m_header.super_node.next_;
  while (plVar10 != (node_ptr)pCVar1) {
    plVar3 = (((type *)&plVar10->next_)->data_).root_plus_size_.m_header.super_node.next_;
    plVar10->next_ = (node_ptr)0x0;
    plVar10->prev_ = (node_ptr)0x0;
    Gudhi::
    Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>_>_>
    ::destroy(&(local_158.entryPool_)->entryPool_,(pointer)&plVar10[-1].prev_);
    plVar10 = plVar3;
  }
  local_158.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ = (node_ptr)0x0;
  local_158.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_ = (node_ptr)0x0;
  test_content_equality<Gudhi::persistence_matrix::Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>
            (&local_110,
             (Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>
              *)local_98);
  local_158.operators_ = (Field_operators *)0x100000000;
  local_158.entryPool_ = (Entry_constructor *)0x200000001;
  local_158.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ =
       (node_ptr)0x200000002;
  local_158.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_ =
       (node_ptr)0x100000004;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)(local_110.
                 super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 5),&local_158);
  local_128[0] = 0;
  local_128[1] = 1;
  local_128[2] = 1;
  local_128[3] = 4;
  local_128[4] = 4;
  local_128[5] = 1;
  local_158.entryPool_ = (Entry_constructor *)&local_d8;
  local_158.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ = (node_ptr)pCVar1;
  local_158.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_ = (node_ptr)pCVar1;
  lVar9 = 4;
  local_158.operators_ = (Field_operators *)local_f8;
  do {
    uVar7 = *(uint *)((long)local_128 + lVar9);
    uVar2 = ((Field_operators *)&(local_158.operators_)->characteristic_)->characteristic_;
    if (uVar2 <= uVar7) {
      uVar7 = uVar7 % uVar2;
    }
    local_138.targetColumn._0_4_ = *(undefined4 *)((long)&uStack_12c + lVar9);
    pEVar6 = Gudhi::
             Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>>
             ::construct<unsigned_int&>
                       ((Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>>
                         *)local_158.entryPool_,(uint *)&local_138);
    plVar10 = local_158.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_;
    (pEVar6->super_Entry_field_element_option).element_ = uVar7;
    if ((pEVar6->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ !=
        (node_ptr)0x0) goto LAB_00178fef;
    (pEVar6->super_Column_hook).super_type.super_type.super_list_node<void_*>.prev_ =
         local_158.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_;
    (pEVar6->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ =
         (node_ptr)pCVar1;
    local_158.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_ =
         (node_ptr)&pEVar6->super_Column_hook;
    (((type *)&plVar10->next_)->super_type).super_list_node<void_*>.next_ =
         (node_ptr)&pEVar6->super_Column_hook;
    lVar9 = lVar9 + 8;
  } while (lVar9 != 0x1c);
  uVar7 = ((Field_operators *)local_98._0_8_)->characteristic_;
  uVar8 = 3;
  if ((int)uVar7 < 4) {
    uVar8 = (undefined4)(3 % (ulong)uVar7);
  }
  local_138.targetColumn._0_4_ = uVar8;
  Gudhi::persistence_matrix::
  _multiply_target_and_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>>
            ((Field_element *)&local_138,&local_158,local_58 + 5);
  plVar10 = local_158.column_.super_type.data_.root_plus_size_.m_header.super_node.next_;
  while (plVar10 != (node_ptr)pCVar1) {
    plVar3 = (((type *)&plVar10->next_)->data_).root_plus_size_.m_header.super_node.next_;
    plVar10->next_ = (node_ptr)0x0;
    plVar10->prev_ = (node_ptr)0x0;
    Gudhi::
    Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>_>_>
    ::destroy(&(local_158.entryPool_)->entryPool_,(pointer)&plVar10[-1].prev_);
    plVar10 = plVar3;
  }
  local_158.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ = (node_ptr)0x0;
  local_158.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_ = (node_ptr)0x0;
  test_content_equality<Gudhi::persistence_matrix::Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>
            (&local_110,
             (Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>
              *)local_98);
  local_158.operators_ = (Field_operators *)0x400000000;
  local_158.entryPool_ = (Entry_constructor *)0x200000001;
  local_158.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ =
       (node_ptr)0x200000004;
  std::
  vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
  ::_M_assign_aux<std::pair<unsigned_int,unsigned_int>const*>
            ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
              *)(local_110.
                 super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 6),&local_158);
  local_128[0] = 0;
  local_128[1] = 1;
  local_128[2] = 1;
  local_128[3] = 4;
  local_128[4] = 4;
  local_128[5] = 1;
  local_158.entryPool_ = (Entry_constructor *)&local_d8;
  local_158.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ = (node_ptr)pCVar1;
  local_158.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_ = (node_ptr)pCVar1;
  lVar9 = 4;
  local_158.operators_ = (Field_operators *)local_f8;
  while( true ) {
    uVar7 = *(uint *)((long)local_128 + lVar9);
    uVar2 = ((Field_operators *)&(local_158.operators_)->characteristic_)->characteristic_;
    if (uVar2 <= uVar7) {
      uVar7 = uVar7 % uVar2;
    }
    local_138.targetColumn._0_4_ = *(undefined4 *)((long)&uStack_12c + lVar9);
    pEVar6 = Gudhi::
             Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>>
             ::construct<unsigned_int&>
                       ((Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>>
                         *)local_158.entryPool_,(uint *)&local_138);
    plVar10 = local_158.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_;
    (pEVar6->super_Entry_field_element_option).element_ = uVar7;
    if ((pEVar6->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ !=
        (node_ptr)0x0) break;
    (pEVar6->super_Column_hook).super_type.super_type.super_list_node<void_*>.prev_ =
         local_158.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_;
    (pEVar6->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ =
         (node_ptr)pCVar1;
    local_158.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_ =
         (node_ptr)&pEVar6->super_Column_hook;
    (((type *)&plVar10->next_)->super_type).super_list_node<void_*>.next_ =
         (node_ptr)&pEVar6->super_Column_hook;
    lVar9 = lVar9 + 8;
    if (lVar9 == 0x1c) {
      uVar7 = ((Field_operators *)local_98._0_8_)->characteristic_;
      uVar8 = 3;
      if ((int)uVar7 < 4) {
        uVar8 = (undefined4)(3 % (ulong)uVar7);
      }
      local_138.targetColumn._0_4_ = uVar8;
      Gudhi::persistence_matrix::
      _multiply_source_and_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>>
                ((Field_element *)&local_138,&local_158,local_58 + 6);
      plVar10 = local_158.column_.super_type.data_.root_plus_size_.m_header.super_node.next_;
      while (plVar10 != (node_ptr)pCVar1) {
        plVar3 = (((type *)&plVar10->next_)->data_).root_plus_size_.m_header.super_node.next_;
        plVar10->next_ = (node_ptr)0x0;
        plVar10->prev_ = (node_ptr)0x0;
        Gudhi::
        Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>_>_>
        ::destroy(&(local_158.entryPool_)->entryPool_,(pointer)&plVar10[-1].prev_);
        plVar10 = plVar3;
      }
      local_158.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ = (node_ptr)0x0;
      local_158.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_ = (node_ptr)0x0;
      test_content_equality<Gudhi::persistence_matrix::Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true>>>
                (&local_110,
                 (Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>
                  *)local_98);
      Gudhi::persistence_matrix::
      Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>::~Matrix
                ((Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>
                  *)local_98);
      std::
      vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
      ::~vector(&local_110);
      if (pcStack_d0 != (char *)0x0) {
        do {
          pcVar4 = *(char **)(pcStack_d0 + (local_c8 - 0x10));
          sVar5 = *(size_type *)(pcStack_d0 + (local_c8 - 8));
          free(pcStack_d0);
          local_c8 = sVar5;
          pcStack_d0 = pcVar4;
        } while (pcVar4 != (char *)0x0);
        local_d8.first = (void *)0x0;
        pcStack_d0 = (char *)0x0;
        local_b8 = local_b0;
      }
      if ((pointer)local_f8._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_f8._8_8_,local_f8._24_8_ - local_f8._8_8_);
      }
      return;
    }
  }
LAB_00178fef:
  __assert_fail("!safemode_or_autounlink || node_algorithms::inited(to_insert)",
                "/usr/include/boost/intrusive/list.hpp",0x33c,
                "iterator boost::intrusive::list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options<false, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, true>>>, boost::intrusive::list_node_traits<void *>, boost::intrusive::safe_link, Gudhi::persistence_matrix::Matrix<Base_options<false, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, true>>::Matrix_column_tag, 1>, unsigned long, false, void>::insert(const_iterator, reference) [ValueTraits = boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options<false, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, true>>>, boost::intrusive::list_node_traits<void *>, boost::intrusive::safe_link, Gudhi::persistence_matrix::Matrix<Base_options<false, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, false, true>>::Matrix_column_tag, 1>, SizeType = unsigned long, ConstantTimeSize = false, HeaderHolder = void]"
               );
}

Assistant:

void test_const_operation() {
  using C = typename Matrix::Column;
  typename Matrix::Column_settings settings(5);

  auto columns = build_general_matrix<C>();
  Matrix m(columns, 5);

  test_content_equality(columns, m);

  if constexpr (Matrix::Option_list::is_z2) {
    columns[10] = {1};
    m.add_to(C({0, 1, 4}, &settings), 10);  // only works with the const version because of reference
  } else {
    columns[10] = {{0, 2}, {1, 4}};
    m.add_to(C({{0, 1}, {1, 4}, {4, 1}}, &settings), 10);
  }
  test_content_equality(columns, m);

  if constexpr (Matrix::Option_list::is_z2) {
    columns[5] = {0, 2, 4};
    m.multiply_target_and_add_to(C({0, 1, 4}, &settings), 3, 5);
  } else {
    columns[5] = {{0, 1}, {1, 2}, {2, 2}, {4, 1}};
    m.multiply_target_and_add_to(C({{0, 1}, {1, 4}, {4, 1}}, &settings), 3, 5);
  }
  test_content_equality(columns, m);

  if constexpr (Matrix::Option_list::is_z2) {
    columns[6] = {1};
    m.multiply_source_and_add_to(3, C({0, 1, 4}, &settings), 6);
  } else {
    columns[6] = {{0, 4}, {1, 2}, {4, 2}};
    m.multiply_source_and_add_to(3, C({{0, 1}, {1, 4}, {4, 1}}, &settings), 6);
  }
  test_content_equality(columns, m);
}